

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# concurrentqueue.h
# Opt level: O2

Block * ylt::detail::moodycamel::
        ConcurrentQueue<std::unique_ptr<cinatra::coro_http_client,std::default_delete<cinatra::coro_http_client>>,ylt::detail::moodycamel::ConcurrentQueueDefaultTraits>
        ::
        create_array<ylt::detail::moodycamel::ConcurrentQueue<std::unique_ptr<cinatra::coro_http_client,std::default_delete<cinatra::coro_http_client>>,ylt::detail::moodycamel::ConcurrentQueueDefaultTraits>::Block>
                  (size_t count)

{
  atomic<bool> *paVar1;
  Block *pBVar2;
  bool *pbVar3;
  bool bVar4;
  
  pBVar2 = (Block *)malloc(count * 0x148);
  if (pBVar2 != (Block *)0x0) {
    pbVar3 = &pBVar2->dynamicallyAllocated;
    while (bVar4 = count != 0, count = count - 1, bVar4) {
      (((atomic<ylt::detail::moodycamel::ConcurrentQueue<std::unique_ptr<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>_>,_ylt::detail::moodycamel::ConcurrentQueueDefaultTraits>::Block_*>
         *)(pbVar3 + -8))->_M_b)._M_p = (__pointer_type)0x0;
      *(Block **)(pbVar3 + -0x40) = (Block *)0x0;
      (((atomic<unsigned_long> *)(pbVar3 + -0x38))->super___atomic_base<unsigned_long>)._M_i = 0;
      (((atomic<unsigned_int> *)(pbVar3 + -0x10))->super___atomic_base<unsigned_int>)._M_i = 0;
      paVar1 = (atomic<bool> *)(pbVar3 + -0x30);
      paVar1->_M_base = (__atomic_base<bool>)0x0;
      paVar1[1] = (__atomic_base<bool>)0x0;
      paVar1[2] = (__atomic_base<bool>)0x0;
      paVar1[3] = (__atomic_base<bool>)0x0;
      paVar1[4] = (__atomic_base<bool>)0x0;
      paVar1[5] = (__atomic_base<bool>)0x0;
      paVar1[6] = (__atomic_base<bool>)0x0;
      paVar1[7] = (__atomic_base<bool>)0x0;
      paVar1 = (atomic<bool> *)(pbVar3 + -0x28);
      paVar1->_M_base = (__atomic_base<bool>)0x0;
      paVar1[1] = (__atomic_base<bool>)0x0;
      paVar1[2] = (__atomic_base<bool>)0x0;
      paVar1[3] = (__atomic_base<bool>)0x0;
      paVar1[4] = (__atomic_base<bool>)0x0;
      paVar1[5] = (__atomic_base<bool>)0x0;
      paVar1[6] = (__atomic_base<bool>)0x0;
      paVar1[7] = (__atomic_base<bool>)0x0;
      paVar1 = (atomic<bool> *)(pbVar3 + -0x20);
      paVar1->_M_base = (__atomic_base<bool>)0x0;
      paVar1[1] = (__atomic_base<bool>)0x0;
      paVar1[2] = (__atomic_base<bool>)0x0;
      paVar1[3] = (__atomic_base<bool>)0x0;
      paVar1[4] = (__atomic_base<bool>)0x0;
      paVar1[5] = (__atomic_base<bool>)0x0;
      paVar1[6] = (__atomic_base<bool>)0x0;
      paVar1[7] = (__atomic_base<bool>)0x0;
      paVar1 = (atomic<bool> *)(pbVar3 + -0x18);
      paVar1->_M_base = (__atomic_base<bool>)0x0;
      paVar1[1] = (__atomic_base<bool>)0x0;
      paVar1[2] = (__atomic_base<bool>)0x0;
      paVar1[3] = (__atomic_base<bool>)0x0;
      paVar1[4] = (__atomic_base<bool>)0x0;
      paVar1[5] = (__atomic_base<bool>)0x0;
      paVar1[6] = (__atomic_base<bool>)0x0;
      paVar1[7] = (__atomic_base<bool>)0x0;
      *pbVar3 = true;
      pbVar3 = pbVar3 + 0x148;
    }
  }
  return pBVar2;
}

Assistant:

static inline U* create_array(size_t count) {
    assert(count > 0);
    U* p = static_cast<U*>(aligned_malloc<U>(sizeof(U) * count));
    if (p == nullptr)
      return nullptr;

    for (size_t i = 0; i != count; ++i) new (p + i) U();
    return p;
  }